

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockDevice.cpp
# Opt level: O0

bool __thiscall BlockDevice::Lock(BlockDevice *this)

{
  BlockDevice *this_local;
  
  return true;
}

Assistant:

bool BlockDevice::Lock()
{
#ifdef _WIN32
    DWORD dwRet;

    std::vector<std::string> lVolumes = GetVolumeList();

    // Logic from: http://www.techtalkz.com/microsoft-device-drivers/250612-lock-entire-disk-physicaldrive-fsctl_lock_volume.html#post983810

        // Open and lock all volumes
    for (auto sVolume : lVolumes)
    {
        std::string sDevice = R"(\\.\)" + sVolume;

        // Open the volume
        HANDLE hdevice = CreateFile(sDevice.c_str(), GENERIC_READ | GENERIC_WRITE, FILE_SHARE_READ | FILE_SHARE_WRITE, nullptr, OPEN_EXISTING, 0, nullptr);
        lLockHandles.push_back(std::make_pair(hdevice, sVolume));

        // Lock the volume to give us exclusive access
        if (!DeviceIoControl(hdevice, FSCTL_LOCK_VOLUME, nullptr, 0, nullptr, 0, &dwRet, nullptr))
            throw util::exception("failed to lock ", sVolume, " filesystem");
    }

    // Discount volumes
    for (auto p : lLockHandles)
    {
        if (!DeviceIoControl(p.first, FSCTL_DISMOUNT_VOLUME, nullptr, 0, nullptr, 0, &dwRet, nullptr))
            throw util::exception("failed to dismount ", p.second, " filesystem");
    }
#endif
    return true;
}